

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void bloaty::anon_unknown_0::ReadELFSymbolTableEntries
               (ElfFile *elf,Section *section,uint64_t index_base,bool is_object,RangeSink *sink)

{
  Elf64_Shdr *pEVar1;
  size_type sVar2;
  undefined1 in_CL;
  Section *in_RDX;
  ElfFile *in_RSI;
  uint64_t in_RDI;
  uint64_t full_addr;
  string_view name;
  string_view sym_range;
  Elf64_Sym sym;
  Elf64_Word i;
  string_view in_stack_00000088;
  Section strtab_section;
  Elf64_Word symbol_count;
  undefined1 in_stack_fffffffffffffedf;
  Section *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  string_view *in_stack_ffffffffffffff08;
  Elf64_Sym *in_stack_ffffffffffffff10;
  undefined4 local_e8;
  Elf64_Word in_stack_ffffffffffffff1c;
  Section *in_stack_ffffffffffffff20;
  string_view local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  int local_b8;
  byte local_b4;
  short local_b2;
  uint local_9c;
  Section local_98;
  Elf64_Word local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint index;
  
  index = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  local_2c = ElfFile::Section::GetEntryCount(in_stack_fffffffffffffee0);
  ElfFile::Section::Section(in_stack_fffffffffffffee0);
  ElfFile::Section::header((Section *)in_RSI);
  ElfFile::ReadSection
            (in_RSI,(Elf64_Word)((ulong)in_RDX >> 0x20),
             (Section *)CONCAT44(index,in_stack_ffffffffffffffe0));
  pEVar1 = ElfFile::Section::header(&local_98);
  if (pEVar1->sh_type == 3) {
    for (local_9c = 1; local_9c < local_2c; local_9c = local_9c + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8);
      ElfFile::Section::ReadSymbol
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      if ((((local_b4 & 0xf) != 3) && (local_b2 != 0)) && (local_b8 != 0)) {
        local_d8 = ElfFile::Section::ReadString(in_RDX,index);
        in_stack_ffffffffffffff20 =
             (Section *)
             ToVMAddr(in_RDI,(uint64_t)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
        in_stack_fffffffffffffee0 =
             (Section *)std::basic_string_view<char,_std::char_traits<char>_>::data(&local_d8);
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_d8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff10,
                   (char *)in_stack_fffffffffffffee0,sVar2 + 1);
        in_stack_ffffffffffffff08 = (string_view *)CONCAT44(in_stack_ffffffffffffff1c,local_e8);
        RangeSink::AddFileRangeForVMAddr
                  ((RangeSink *)sym.st_size,(char *)sym.st_value,sym._0_8_,in_stack_00000088);
        RangeSink::AddFileRangeForVMAddr
                  ((RangeSink *)sym.st_size,(char *)sym.st_value,sym._0_8_,in_stack_00000088);
      }
    }
    return;
  }
  Throw(in_stack_fffffffffffffef0,(int)(in_RDI >> 0x20));
}

Assistant:

static void ReadELFSymbolTableEntries(const ElfFile& elf,
                                      const ElfFile::Section& section,
                                      uint64_t index_base, bool is_object,
                                      RangeSink* sink) {
  Elf64_Word symbol_count = section.GetEntryCount();

  // Find the corresponding section where the strings for the symbol
  // table can be found.
  ElfFile::Section strtab_section;
  elf.ReadSection(section.header().sh_link, &strtab_section);
  if (strtab_section.header().sh_type != SHT_STRTAB) {
    THROW("symtab section pointed to non-strtab section");
  }

  for (Elf64_Word i = 1; i < symbol_count; i++) {
    Elf64_Sym sym;
    string_view sym_range;
    section.ReadSymbol(i, &sym, &sym_range);

    if (ELF64_ST_TYPE(sym.st_info) == STT_SECTION ||
        sym.st_shndx == STN_UNDEF ||
        sym.st_name == SHN_UNDEF) {
      continue;
    }

    string_view name = strtab_section.ReadString(sym.st_name);
    uint64_t full_addr =
        ToVMAddr(sym.st_value, index_base + sym.st_shndx, is_object);
    // Capture the trailing NULL.
    name = string_view(name.data(), name.size() + 1);
    sink->AddFileRangeForVMAddr("elf_symtab_name", full_addr, name);
    sink->AddFileRangeForVMAddr("elf_symtab_sym", full_addr, sym_range);
  }
}